

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSendSession.cpp
# Opt level: O2

void __thiscall FileSendSession::on_output(FileSendSession *this,Poll *p)

{
  SendBuffer *this_00;
  uint uVar1;
  int __fd;
  char *__buf;
  ssize_t sVar2;
  ostream *poVar3;
  string *this_01;
  path pStack_88;
  string local_68 [32];
  string local_48 [32];
  
  this_01 = (string *)&pStack_88;
  this_00 = &this->buff;
  if ((this->buff).read == (this->buff).full) {
    std::istream::read((char *)&this->stream,0x141550);
    SendBuffer::load_bytes
              (this_00,FILE_SEND_BUF,
               *(int *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x8)
    ;
    uVar1 = *(uint *)(&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x20
                     + *(long *)(*(long *)&(this->stream).
                                           super_basic_fstream<char,_std::char_traits<char>_> +
                                -0x18));
    if ((char)((uVar1 & 2) >> 1) != '\0' || (uVar1 & 5) == 0) goto LAB_0012e5a7;
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&(this->super_Subscriber).name);
    std::operator<<(poVar3,": Error in reading from file, disconnecting\n");
    if ((this->error).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_0012e6dd;
    this_01 = local_48;
    std::__cxx11::string::string(this_01,(string *)&this->file);
    std::function<void_(boost::filesystem::path)>::operator()(&this->error,(path *)this_01);
  }
  else {
LAB_0012e5a7:
    __fd = Subscriber::get_fd(&this->super_Subscriber);
    __buf = SendBuffer::read_pos(this_00);
    sVar2 = write(__fd,__buf,(long)(this->buff).full - (long)(this->buff).read);
    if ((int)sVar2 < 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&(this->super_Subscriber).name);
      std::operator<<(poVar3,": Error in writing to socket, disconnecting\n");
      if ((this->error).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_0012e6dd;
      this_01 = local_68;
      std::__cxx11::string::string(this_01,(string *)&this->file);
      std::function<void_(boost::filesystem::path)>::operator()(&this->error,(path *)this_01);
    }
    else {
      SendBuffer::on_read_bytes(this_00,(int)sVar2);
      if ((this->buff).read != (this->buff).full) {
        return;
      }
      if (((&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x20)
           [*(long *)(*(long *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_> +
                     -0x18)] & 2) == 0) {
        return;
      }
      if ((this->success).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_0012e6dd;
      std::__cxx11::string::string((string *)&pStack_88,(string *)&this->file);
      std::function<void_(boost::filesystem::path)>::operator()(&this->success,&pStack_88);
    }
  }
  std::__cxx11::string::~string(this_01);
LAB_0012e6dd:
  Poll::unsubscribe(p,&this->super_Subscriber);
  return;
}

Assistant:

void FileSendSession::on_output(Poll &p) {
  if (buff.is_all_read()) {
    stream.read(FILE_SEND_BUF, FILE_SEND_BUF_SIZE);
    buff.load_bytes(FILE_SEND_BUF, stream.gcount());
    if (!stream && !stream.eof()) {
      std::cout << this->name << ": Error in reading from file, disconnecting\n";
      if (this->error)
        this->error(file);
      p.unsubscribe(*this);
      return;
    }
  }
  int n = write(this->get_fd(), buff.read_pos(), buff.remaining_to_read());
  if (n < 0) {
    std::cout << this->name << ": Error in writing to socket, disconnecting\n";
    if (this->error)
      this->error(file);
    p.unsubscribe(*this);
    return;
  }
  buff.on_read_bytes(n);
  if (buff.is_all_read() && stream.eof()) {
    if (this->success)
      this->success(file);
    p.unsubscribe(*this);
  }
}